

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

int Gia_ManConeMark_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots,int nLimit)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  Gia_Obj_t *pObj_00;
  uint uVar4;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar2 = Gia_ObjId(p,pObj);
  uVar4 = 0;
  if (piVar1[iVar2] != p->nTravIds) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar2 = (int)*(ulong *)pObj;
    uVar3 = *(ulong *)pObj & 0x1fffffff;
    if (uVar3 == 0x1fffffff || iVar2 < 0) {
      if (iVar2 < 0 && (int)uVar3 != 0x1fffffff) {
        iVar2 = Gia_ManConeMark_rec(p,pObj + -uVar3,vRoots,nLimit);
        if (iVar2 != 0) {
          return 1;
        }
      }
      else {
        iVar2 = Gia_ObjIsRo(p,pObj);
        if (iVar2 == 0) {
          if (((~*(uint *)pObj & 0x9fffffff) != 0) ||
             (iVar2 = Gia_ObjCioId(pObj), p->vCis->nSize - p->nRegs <= iVar2)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                          ,0xf3,
                          "int Gia_ManConeMark_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
          }
        }
        else {
          pObj_00 = Gia_ObjRoToRi(p,pObj);
          iVar2 = Gia_ObjId(p,pObj_00);
          Vec_IntPush(vRoots,iVar2);
        }
      }
    }
    else {
      iVar2 = Gia_ManConeMark_rec(p,pObj + -uVar3,vRoots,nLimit);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = Gia_ManConeMark_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vRoots,
                                  nLimit);
      if (iVar2 != 0) {
        return 1;
      }
    }
    uVar4 = (uint)(nLimit < vRoots->nSize);
  }
  return uVar4;
}

Assistant:

int Gia_ManConeMark_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots, int nLimit )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin1(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( Gia_ObjIsPi(p, pObj) )
    {}
    else assert( 0 );
    return (int)(Vec_IntSize(vRoots) > nLimit);
}